

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O3

value * helics::fileops::loadToml(value *__return_storage_ptr__,string *tomlString)

{
  string fname;
  spec s;
  char cVar1;
  ifstream file;
  undefined8 in_stack_fffffffffffffda0;
  undefined1 *puVar2;
  undefined8 in_stack_fffffffffffffdb0;
  long in_stack_fffffffffffffdb8;
  ushort uStack_222;
  istream local_220 [520];
  
  if (tomlString->_M_string_length < 0x81) {
    std::ifstream::ifstream(local_220,(string *)tomlString,_S_bin);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      loadTomlStr(__return_storage_ptr__,tomlString);
    }
    else {
      puVar2 = &stack0xfffffffffffffdb8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffda8,"unknown file","");
      fname.field_2._M_allocated_capacity = (ulong)uStack_222 << 0x30;
      fname._M_dataplus._M_p = (pointer)0x1;
      fname._M_string_length = 0;
      fname.field_2._8_8_ = in_stack_fffffffffffffda0;
      s.version.patch = (int)in_stack_fffffffffffffdb0;
      s.v1_1_0_allow_control_characters_in_comments =
           (bool)(char)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
      s.v1_1_0_allow_newlines_in_inline_tables =
           (bool)(char)((ulong)in_stack_fffffffffffffdb0 >> 0x28);
      s.v1_1_0_allow_trailing_comma_in_inline_tables =
           (bool)(char)((ulong)in_stack_fffffffffffffdb0 >> 0x30);
      s.v1_1_0_allow_non_english_in_bare_keys =
           (bool)(char)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
      s.version._0_8_ = puVar2;
      s.v1_1_0_add_escape_sequence_e = (bool)(char)in_stack_fffffffffffffdb8;
      s.v1_1_0_add_escape_sequence_x = (bool)(char)((ulong)in_stack_fffffffffffffdb8 >> 8);
      s.v1_1_0_make_seconds_optional = (bool)(char)((ulong)in_stack_fffffffffffffdb8 >> 0x10);
      s.ext_hex_float = (bool)(char)((ulong)in_stack_fffffffffffffdb8 >> 0x18);
      s.ext_num_suffix = (bool)(char)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
      s.ext_null_value = (bool)(char)((ulong)in_stack_fffffffffffffdb8 >> 0x28);
      s._22_2_ = (short)((ulong)in_stack_fffffffffffffdb8 >> 0x30);
      toml::parse<toml::type_config>(__return_storage_ptr__,local_220,fname,s);
      if (puVar2 != &stack0xfffffffffffffdb8) {
        operator_delete(puVar2,in_stack_fffffffffffffdb8 + 1);
      }
    }
    std::ifstream::~ifstream(local_220);
  }
  else {
    loadTomlStr(__return_storage_ptr__,tomlString);
  }
  return __return_storage_ptr__;
}

Assistant:

toml::value loadToml(const std::string& tomlString)
{
    if (tomlString.size() > 128) {
        try {
            return loadTomlStr(tomlString);
        }
        catch (const std::invalid_argument&) {
            ;  // just pass through this was an assumption
        }
    }
    std::ifstream file(tomlString, std::ios_base::binary);

    try {
        if (file.is_open()) {
            return toml::parse(file);
        }
        return loadTomlStr(tomlString);
    }
    catch (const toml::exception& se) {
        throw(std::invalid_argument(se.what()));
    }
}